

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O2

void irem_ga20_cache_samples(ga20_state *chip,IremGA20_channel_def *ch)

{
  UINT8 UVar1;
  UINT8 *pUVar2;
  
  pUVar2 = chip->rom;
  UVar1 = pUVar2[ch->pos];
  if (UVar1 == '\0') {
    ch->play = '\0';
  }
  else {
    ch->smpl1 = UVar1 + 0x80;
  }
  UVar1 = pUVar2[ch->pos + 1];
  if (UVar1 != '\0') {
    ch->smpl2 = UVar1 + 0x80;
  }
  return;
}

Assistant:

INLINE void irem_ga20_cache_samples(ga20_state *chip, struct IremGA20_channel_def* ch)
{
	if (! chip->rom[ch->pos])	// check for sample end marker
		ch->play = 0;
	else
		ch->smpl1 = chip->rom[ch->pos] - 0x80;
	if (chip->rom[ch->pos + 1])
		ch->smpl2 = chip->rom[ch->pos + 1] - 0x80;
	
	return;
}